

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void exe_reconstructor::fixupdecompressor::
     decompressrelocstring<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                first,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      last,DwordVector *relocs)

{
  byte bVar1;
  iterator iVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  uint32_t value;
  uint32_t value_1;
  uint local_4c;
  uint local_48;
  uint32_t local_44;
  uchar *local_40;
  byte *local_38;
  
  local_4c = 0;
  if (first._M_current < last._M_current) {
    local_40 = first._M_current;
    local_38 = last._M_current;
    do {
      bVar1 = *first._M_current;
      uVar4 = bVar1 & 0x1f;
      first._M_current = first._M_current + 1;
      if ((char)bVar1 < '\0') {
        local_44 = 0;
        sVar3 = getrelocvalue<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (&local_44,0,first,last);
        local_4c = local_4c + local_44;
        iVar2._M_current =
             (relocs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (relocs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)relocs,iVar2,&local_4c);
        }
        else {
          *iVar2._M_current = local_4c;
          (relocs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        last._M_current = local_38;
        iVar5 = uVar4 + 1;
        first._M_current = first._M_current + sVar3;
        do {
          local_4c = local_4c + (bVar1 >> 3 & 0xc) + 4;
          iVar2._M_current =
               (relocs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (relocs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)relocs,iVar2,&local_4c);
          }
          else {
            *iVar2._M_current = local_4c;
            (relocs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      else {
        local_48 = uVar4;
        if ((bVar1 & 0x20) != 0) {
          sVar3 = getrelocvalue<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (&local_48,5,first,last);
          first._M_current = first._M_current + sVar3;
        }
        if (bVar1 < 0x40) {
          printf("NOTE: unexpected compressed reloc with bit6=0 [%04x] b7:b6:b5=%d%d%d base=%08x val=%08x\n"
                 ,(ulong)(uint)((int)first._M_current - (int)local_40),0,0,(ulong)(bVar1 >> 5),
                 (ulong)local_4c,local_48);
          local_4c = local_48;
        }
        else {
          local_4c = local_4c + local_48;
        }
        iVar2._M_current =
             (relocs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (relocs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)relocs,iVar2,&local_4c);
        }
        else {
          *iVar2._M_current = local_4c;
          (relocs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
    } while (first._M_current < last._M_current);
  }
  return;
}

Assistant:

static void decompressrelocstring(ITER first, ITER last, DwordVector& relocs)
        {
            //printf("decompressrelocstring(%04x)\n", int(last-first));
            uint32_t base=0;
            ITER p= first;
            while (p<last) {
                //printf("%04x:<%02x>", int(p-first), *p);
                bool bit7= *p&0x80;
                if (bit7) {
                    uint32_t increment= 4*(((*p>>5)&3)+1);
                    uint32_t count= (*p&0x1f)+1;
                    p++;
                    uint32_t value= 0;
                    p+=getrelocvalue(value, 0, p, last);

                    base += value;
                    relocs.push_back(base);
                    while (count--) {
                        base += increment;
                        relocs.push_back(base);
                    }
                }
                else {
                    bool bit6= *p&0x40;
                    bool bit5= *p&0x20;

                    uint32_t value= *p&0x1f;
                    p++;
                    if (bit5)
                        p+=getrelocvalue(value, 5, p, last);

                    if (bit6)
                        base += value;
                    else {
                        printf("NOTE: unexpected compressed reloc with bit6=0 [%04x] b7:b6:b5=%d%d%d base=%08x val=%08x\n", int(p-first), bit7, bit6, bit5, base, value);
                        base = value;
                    }
                    relocs.push_back(base);
                }
            }
            //printf("reloc end base->%08x\n", base);
        }